

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigsf.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  FILE *__stream;
  int iVar3;
  uint value;
  int *piVar4;
  ulong uVar5;
  char *pcVar6;
  undefined8 uVar7;
  mapped_type *pmVar8;
  bool bVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_22c0;
  long local_2290;
  off_t i;
  char gsf_path [4096];
  allocator local_1279;
  string local_1278 [39];
  allocator local_1251;
  string local_1250 [32];
  undefined1 local_1230 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  int local_11f8;
  uint32_t num;
  int num_error;
  uint32_t entrypoint;
  string bytestr;
  size_t local_11d0;
  off_t offset;
  uint8_t *hex;
  bool in_number;
  allocator local_11a1;
  string local_11a0 [8];
  string hexstring;
  ulong local_1180;
  size_t romsize;
  size_t size_of_num;
  off_t offset_of_num;
  uint8_t exe [268];
  uint local_1050;
  uint32_t count;
  uint32_t load_offset;
  char libname [4096];
  char *gsf_basename;
  int argnum;
  int argi;
  char *outname;
  char *psfby;
  char *endptr;
  long longval;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  longval = (long)argv;
  argv_local._0_4_ = argc;
  if (argc == 1) {
    usage(*argv);
    return 1;
  }
  psfby = (char *)0x0;
  outname = (char *)0x0;
  _argnum = 0;
  gsf_basename._4_4_ = 1;
  while( true ) {
    bVar9 = false;
    if (gsf_basename._4_4_ < (int)argv_local) {
      bVar9 = **(char **)(longval + (long)gsf_basename._4_4_ * 8) == '-';
    }
    if (!bVar9) break;
    iVar3 = strcmp(*(char **)(longval + (long)gsf_basename._4_4_ * 8),"--help");
    if (iVar3 == 0) {
      usage(*(char **)longval);
      return 1;
    }
    iVar3 = strcmp(*(char **)(longval + (long)gsf_basename._4_4_ * 8),"--psfby");
    if ((iVar3 == 0) ||
       (iVar3 = strcmp(*(char **)(longval + (long)gsf_basename._4_4_ * 8),"--gsfby"), iVar3 == 0)) {
      if ((int)argv_local <= gsf_basename._4_4_ + 1) {
        fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                *(undefined8 *)(longval + (long)gsf_basename._4_4_ * 8));
        return 1;
      }
      outname = *(char **)(longval + (long)(gsf_basename._4_4_ + 1) * 8);
    }
    else {
      iVar3 = strcmp(*(char **)(longval + (long)gsf_basename._4_4_ * 8),"-o");
      if (iVar3 != 0) {
        fprintf(_stderr,"Error: Unknown option \"%s\"\n",
                *(undefined8 *)(longval + (long)gsf_basename._4_4_ * 8));
        return 1;
      }
      if ((int)argv_local <= gsf_basename._4_4_ + 1) {
        fprintf(_stderr,"Error: Too few arguments for \"%s\"\n",
                *(undefined8 *)(longval + (long)gsf_basename._4_4_ * 8));
        return 1;
      }
      _argnum = *(long *)(longval + (long)(gsf_basename._4_4_ + 1) * 8);
    }
    gsf_basename._4_4_ = gsf_basename._4_4_ + 2;
  }
  iVar3 = (int)argv_local - gsf_basename._4_4_;
  if ((iVar3 < 3) || (4 < iVar3)) {
    fprintf(_stderr,"Error: Too few/more arguments\n");
    return 1;
  }
  libname._4088_8_ = *(long *)(longval + (long)gsf_basename._4_4_ * 8);
  if (_argnum == 0) {
    _argnum = libname._4088_8_;
  }
  sprintf((char *)&count,"%s.gsflib",libname._4088_8_);
  endptr = (char *)strtol(*(char **)(longval + (long)(gsf_basename._4_4_ + 1) * 8),&psfby,0x10);
  if (((*psfby != '\0') || (piVar4 = __errno_location(), *piVar4 == 0x22)) || ((long)endptr < 0)) {
    fprintf(_stderr,"Error: Number format error \"%s\"\n",
            *(undefined8 *)(longval + (long)(gsf_basename._4_4_ + 1) * 8));
    return 1;
  }
  value = (uint)endptr;
  if (((value < 0x8000000) || (0x9ffffff < value)) && ((value < 0x2000000 || (0x203ffff < value))))
  {
    fprintf(_stderr,"Error: Load load_offset 0x%08X is out of range\n",(ulong)endptr & 0xffffffff);
    fprintf(_stderr,
            "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n"
           );
    return 1;
  }
  local_1050 = 1;
  if (3 < iVar3) {
    endptr = (char *)strtol(*(char **)(longval + (long)(gsf_basename._4_4_ + 3) * 8),&psfby,10);
    if (((*psfby != '\0') || (piVar4 = __errno_location(), *piVar4 == 0x22)) || ((long)endptr < 0))
    {
      fprintf(_stderr,"Error: Number format error \"%s\"\n",
              *(undefined8 *)(longval + (long)(gsf_basename._4_4_ + 3) * 8));
      return 1;
    }
    local_1050 = (uint)endptr;
  }
  memset(&offset_of_num,0,0x10c);
  size_of_num = 0;
  romsize = 0;
  local_1180 = 0;
  if (**(char **)(longval + (long)(gsf_basename._4_4_ + 2) * 8) == '=') {
    lVar1 = *(long *)(longval + 0x10 + (long)gsf_basename._4_4_ * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11a0,(char *)(lVar1 + 1),&local_11a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_11a1);
    uVar5 = std::__cxx11::string::length();
    if ((uVar5 & 1) == 0) {
      local_1180 = std::__cxx11::string::length();
      local_1180 = local_1180 >> 1;
      if (local_1180 < 0x101) {
        bVar2 = false;
        for (local_11d0 = 0; (long)local_11d0 < (long)local_1180; local_11d0 = local_11d0 + 1) {
          std::__cxx11::string::substr((ulong)&num_error,(ulong)local_11a0);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          iVar3 = strcasecmp(pcVar6,"NN");
          if (iVar3 == 0) {
            if (romsize == 0) {
              size_of_num = local_11d0;
              romsize = 1;
              bVar2 = true;
            }
            else {
              if (!bVar2) {
                fprintf(_stderr,"Error: Multiple number field\n");
                argv_local._4_4_ = 1;
                bVar9 = true;
                goto LAB_00109e57;
              }
              romsize = romsize + 1;
            }
LAB_00109e4d:
            bVar9 = false;
          }
          else {
            bVar2 = false;
            pcVar6 = (char *)std::__cxx11::string::c_str();
            endptr = (char *)strtol(pcVar6,&psfby,0x10);
            if ((*psfby == '\0') && (piVar4 = __errno_location(), *piVar4 != 0x22)) {
              exe[local_11d0 + 4] = (uint8_t)endptr;
              goto LAB_00109e4d;
            }
            __stream = _stderr;
            uVar7 = std::__cxx11::string::c_str();
            fprintf(__stream,"Error: Number format error \"%s\"\n",uVar7);
            argv_local._4_4_ = 1;
            bVar9 = true;
          }
LAB_00109e57:
          std::__cxx11::string::~string((string *)&num_error);
          if (bVar9) goto LAB_00109e92;
        }
        bVar9 = false;
      }
      else {
        fprintf(_stderr,"Error: Output size error\n");
        argv_local._4_4_ = 1;
        bVar9 = true;
      }
    }
    else {
      fprintf(_stderr,"Error: Hex string length error\n");
      argv_local._4_4_ = 1;
      bVar9 = true;
    }
LAB_00109e92:
    std::__cxx11::string::~string(local_11a0);
    if (bVar9) {
      return argv_local._4_4_;
    }
  }
  else {
    endptr = (char *)strtol(*(char **)(longval + (long)(gsf_basename._4_4_ + 2) * 8),&psfby,10);
    if (((*psfby != '\0') || (piVar4 = __errno_location(), *piVar4 == 0x22)) || ((long)endptr < 0))
    {
      fprintf(_stderr,"Error: Number format error \"%s\"\n",
              *(undefined8 *)(longval + (long)(gsf_basename._4_4_ + 2) * 8));
      return 1;
    }
    romsize = (size_t)endptr;
    local_1180._0_4_ = (uint32_t)endptr;
  }
  if (romsize < 5) {
    num = value & 0xff000000;
    if (num == 0x9000000) {
      num = 0x8000000;
    }
    writeInt((uint8_t *)&offset_of_num,num);
    writeInt((uint8_t *)((long)&offset_of_num + 4),value);
    writeInt(exe,(uint32_t)local_1180);
    local_11f8 = 0;
    for (tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < local_1050;
        tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1230);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1250,"_lib",&local_1251);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_1230,(key_type *)local_1250);
      std::__cxx11::string::operator=((string *)pmVar8,(char *)&count);
      std::__cxx11::string::~string(local_1250);
      std::allocator<char>::~allocator((allocator<char> *)&local_1251);
      if ((outname != (char *)0x0) && (iVar3 = strcmp(outname,""), iVar3 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1278,"gsfby",&local_1279);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_1230,(key_type *)local_1278);
        std::__cxx11::string::operator=((string *)pmVar8,outname);
        std::__cxx11::string::~string(local_1278);
        std::allocator<char>::~allocator((allocator<char> *)&local_1279);
      }
      if (local_1050 == 1) {
        sprintf((char *)&i,"%s.minigsf",_argnum);
      }
      else {
        sprintf((char *)&i,"%s-%04d.minigsf",_argnum,
                (ulong)tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      }
      if (-1 < (long)size_of_num) {
        for (local_2290 = 0; local_2290 < (long)romsize; local_2290 = local_2290 + 1) {
          exe[size_of_num + local_2290 + 4] =
               (uint8_t)(tags._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ >>
                        ((byte)(local_2290 << 3) & 0x1f));
        }
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&local_22c0,
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1230);
      bVar9 = exe2gsf((char *)&i,(uint8_t *)&offset_of_num,(uint32_t)local_1180 + 0xc,&local_22c0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map(&local_22c0);
      if (bVar9) {
        printf("Created %s\n",&i);
      }
      else {
        printf("Error: Unable to create %s\n",&i);
        local_11f8 = local_11f8 + 1;
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1230);
    }
    argv_local._4_4_ = (uint)(local_11f8 != 0);
  }
  else {
    fprintf(_stderr,"Error: Output number size error\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	char *outname = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			outname = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum < 3 || argnum > 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * gsf_basename = argv[argi];
	if (outname == NULL) outname = gsf_basename;

	char libname[PATH_MAX];
	sprintf(libname, "%s.gsflib", gsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;
	if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
		fprintf(stderr, "Error: Load load_offset 0x%08X is out of range\n", load_offset);
		fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
		return EXIT_FAILURE;
	}

	uint32_t count = 1;
	if (argnum >= 4)
	{
		longval = strtol(argv[argi + 3], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
			return EXIT_FAILURE;
		}
		count = (uint32_t)longval;
	}

	uint8_t exe[GSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, GSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[GSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	uint32_t entrypoint = load_offset & 0xFF000000;
	if (entrypoint == 0x9000000)
		entrypoint = 0x8000000;
	writeInt(&exe[0], entrypoint);
	writeInt(&exe[4], load_offset);
	writeInt(&exe[8], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		char gsf_path[PATH_MAX];
		if (count != 1)
			sprintf(gsf_path, "%s-%04d.minigsf", outname, num);
		else
			sprintf(gsf_path, "%s.minigsf", outname);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[GSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2gsf(gsf_path, exe, GSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", gsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", gsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}